

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64map_checked.hh
# Opt level: O3

Roaring64Map * __thiscall
doublechecked::Roaring64Map::operator|
          (Roaring64Map *__return_storage_ptr__,Roaring64Map *this,Roaring64Map *o)

{
  bool bVar1;
  Roaring64Map inplace;
  undefined1 auStack_88 [104];
  
  roaring::Roaring64Map::operator|((Roaring64Map *)auStack_88,&this->plain,&o->plain);
  Roaring64Map(__return_storage_ptr__,(Roaring64Map *)auStack_88);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
  ::~_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
               *)auStack_88);
  Roaring64Map((Roaring64Map *)auStack_88,this);
  roaring::Roaring64Map::operator|=((Roaring64Map *)auStack_88,&o->plain);
  std::
  _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
  ::_M_insert_range_unique<std::_Rb_tree_const_iterator<unsigned_long>>
            ((_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
              *)(auStack_88 + 0x38),(o->check)._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
             (_Rb_tree_const_iterator<unsigned_long>)&(o->check)._M_t._M_impl.super__Rb_tree_header)
  ;
  bVar1 = operator==(__return_storage_ptr__,(Roaring64Map *)auStack_88);
  _assert_true((ulong)bVar1,"ans == (inplace |= o)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/roaring64map_checked.hh"
               ,0x1e0);
  ~Roaring64Map((Roaring64Map *)auStack_88);
  return __return_storage_ptr__;
}

Assistant:

Roaring64Map operator|(const Roaring64Map &o) const {
        Roaring64Map ans(plain | o.plain);

        Roaring64Map inplace(*this);
        assert_true(ans ==
                    (inplace |= o));  // validate against in-place version

        return ans;
    }